

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O2

Gia_Man_t * Gia_MiniAigMiter(Mini_Aig_t *p,int *pEquivs)

{
  bool bVar1;
  int nCap;
  int iVar2;
  int iVar3;
  int iVar4;
  Gia_Man_t *p_00;
  char *pcVar5;
  Vec_Int_t *p_01;
  Gia_Man_t *pGVar6;
  int iVar7;
  long lVar8;
  int local_4c;
  
  nCap = p->nSize / 2;
  p_00 = Gia_ManStart(nCap * 2);
  pcVar5 = Abc_UtilStrsav("MiniAig");
  p_00->pName = pcVar5;
  p_01 = Vec_IntAlloc(nCap);
  local_4c = 0;
  Vec_IntPush(p_01,0);
  Gia_ManHashAlloc(p_00);
  for (iVar7 = 1; iVar7 < nCap; iVar7 = iVar7 + 1) {
    iVar2 = Mini_AigNodeIsPi(p,iVar7);
    if (iVar2 == 0) {
      iVar2 = Mini_AigNodeIsPo(p,iVar7);
      if (iVar2 == 0) {
        pGVar6 = (Gia_Man_t *)p;
        iVar2 = Mini_AigNodeIsAnd(p,iVar7);
        if (iVar2 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                        ,0x2e7,"Gia_Man_t *Gia_MiniAigMiter(Mini_Aig_t *, int *)");
        }
        iVar2 = Gia_ObjFromMiniFanin0Copy(pGVar6,p_01,p,iVar7);
        iVar3 = Gia_ObjFromMiniFanin1Copy(pGVar6,p_01,p,iVar7);
        iVar2 = Gia_ManHashAnd(p_00,iVar2,iVar3);
      }
      else {
        local_4c = local_4c + 1;
        iVar2 = -1;
      }
    }
    else {
      iVar2 = Gia_ManAppendCi(p_00);
    }
    Vec_IntPush(p_01,iVar2);
  }
  if (p_01->nSize != nCap) {
    __assert_fail("Vec_IntSize(vCopies) == nNodes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                  ,0x2ea,"Gia_Man_t *Gia_MiniAigMiter(Mini_Aig_t *, int *)");
  }
  if (local_4c <= p->nRegs) {
    __assert_fail("nPos > Mini_AigRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                  ,0x2eb,"Gia_Man_t *Gia_MiniAigMiter(Mini_Aig_t *, int *)");
  }
  for (lVar8 = 1; lVar8 < nCap; lVar8 = lVar8 + 1) {
    if (pEquivs[lVar8] != -1) {
      iVar7 = Vec_IntEntry(p_01,(int)lVar8);
      iVar2 = Abc_Lit2Var(pEquivs[lVar8]);
      iVar2 = Vec_IntEntry(p_01,iVar2);
      iVar3 = Abc_LitIsCompl(pEquivs[lVar8]);
      iVar2 = Abc_LitNotCond(iVar2,iVar3);
      iVar7 = Gia_ManHashXor(p_00,iVar7,iVar2);
      Gia_ManAppendCo(p_00,iVar7);
    }
  }
  iVar7 = p_00->vCos->nSize;
  iVar3 = 0;
  for (iVar2 = 1; iVar2 < nCap; iVar2 = iVar2 + 1) {
    pGVar6 = (Gia_Man_t *)p;
    iVar4 = Mini_AigNodeIsPo(p,iVar2);
    if ((iVar4 != 0) &&
       (iVar4 = iVar3 + 1, bVar1 = local_4c - p->nRegs <= iVar3, iVar3 = iVar4, bVar1)) {
      iVar4 = Gia_ObjFromMiniFanin0Copy(pGVar6,p_01,p,iVar2);
      Gia_ManAppendCo(p_00,iVar4);
    }
  }
  if (iVar3 != local_4c) {
    __assert_fail("iPos == nPos",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                  ,0x2fe,"Gia_Man_t *Gia_MiniAigMiter(Mini_Aig_t *, int *)");
  }
  if (p->nRegs != p_00->vCos->nSize - iVar7) {
    __assert_fail("Mini_AigRegNum(p) == Gia_ManCoNum(pGia) - Temp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                  ,0x2ff,"Gia_Man_t *Gia_MiniAigMiter(Mini_Aig_t *, int *)");
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  Gia_ManHashStop(p_00);
  Vec_IntFree(p_01);
  pGVar6 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_MiniAigMiter( Mini_Aig_t * p, int * pEquivs )
{
    Gia_Man_t * pGia, * pTemp;
    Vec_Int_t * vCopies;
    int i, iGiaLit = 0, iGiaLit2, nNodes, iPos = 0, nPos = 0, Temp;
    // get the number of nodes
    nNodes = Mini_AigNodeNum(p);
    // create ABC network
    pGia = Gia_ManStart( 2 * nNodes );
    pGia->pName = Abc_UtilStrsav( "MiniAig" );
    // create mapping from MiniAIG objects into ABC objects
    vCopies = Vec_IntAlloc( nNodes );
    Vec_IntPush( vCopies, 0 );
    // iterate through the objects
    Gia_ManHashAlloc( pGia );
    for ( i = 1; i < nNodes; i++ )
    {
        if ( Mini_AigNodeIsPi( p, i ) )
            iGiaLit = Gia_ManAppendCi(pGia);
        else if ( Mini_AigNodeIsPo( p, i ) )
        {
            nPos++;
            Vec_IntPush( vCopies, -1 );
            continue;
        }
        else if ( Mini_AigNodeIsAnd( p, i ) )
            iGiaLit = Gia_ManHashAnd(pGia, Gia_ObjFromMiniFanin0Copy(pGia, vCopies, p, i), Gia_ObjFromMiniFanin1Copy(pGia, vCopies, p, i));
        else assert( 0 );
        Vec_IntPush( vCopies, iGiaLit );
    }
    assert( Vec_IntSize(vCopies) == nNodes );
    assert( nPos > Mini_AigRegNum(p) );
    // create miters for each equiv class
    for ( i = 1; i < nNodes; i++ )
    {
        if ( pEquivs[i] == -1 )
            continue;
        iGiaLit = Vec_IntEntry(vCopies, i);
        iGiaLit2 = Abc_LitNotCond( Vec_IntEntry(vCopies, Abc_Lit2Var(pEquivs[i])), Abc_LitIsCompl(pEquivs[i]) );
        Gia_ManAppendCo( pGia, Gia_ManHashXor(pGia, iGiaLit, iGiaLit2) );
    }
    // create flop inputs
    Temp = Gia_ManCoNum(pGia);
    for ( i = 1; i < nNodes; i++ )
    {
        if ( !Mini_AigNodeIsPo( p, i ) )
            continue;
        if ( iPos++ >= nPos - Mini_AigRegNum(p) )
            Gia_ManAppendCo(pGia, Gia_ObjFromMiniFanin0Copy(pGia, vCopies, p, i));
    }
    assert( iPos == nPos );
    assert( Mini_AigRegNum(p) == Gia_ManCoNum(pGia) - Temp );
    Gia_ManSetRegNum( pGia, Mini_AigRegNum(p) );
    Gia_ManHashStop( pGia );
    Vec_IntFree( vCopies );
    pGia = Gia_ManCleanup( pTemp = pGia );
    Gia_ManStop( pTemp );
    return pGia;
}